

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_animatable_default<tinyusdz::value::texcoord2f>
                   (string *__return_storage_ptr__,Animatable<tinyusdz::value::texcoord2f> *v,
                   uint32_t indent)

{
  texcoord2f a;
  stringstream ss;
  texcoord2f local_1a0;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  if (v->_blocked == true) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_188,"None",4);
  }
  if (v->_has_value == true) {
    if (v->_blocked != false) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]","");
      goto LAB_002ee504;
    }
    local_1a0 = v->_value;
    ::std::operator<<(local_188,&local_1a0);
  }
  ::std::__cxx11::stringbuf::str();
LAB_002ee504:
  ::std::__cxx11::stringstream::~stringstream(local_198);
  ::std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}